

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnFunctionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Result RVar1;
  
  if (name._M_len == 0) {
    name = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names
                             ,func_index);
  }
  PrintDetails(this,"   - %d: F <%.*s> func=%u",(ulong)index,name._M_len,name._M_str,func_index);
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnFunctionSymbol(Index index,
                                             uint32_t flags,
                                             std::string_view name,
                                             Index func_index) {
  if (name.empty()) {
    name = GetFunctionName(func_index);
  }
  PrintDetails("   - %d: F <" PRIstringview "> func=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), func_index);
  return PrintSymbolFlags(flags);
}